

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_hpf1_config *
ma_hpf1_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double cutoffFrequency)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_hpf1_config *in_RDI;
  double in_XMM0_Qa;
  
  if (in_RDI != (ma_hpf1_config *)0x0) {
    memset(in_RDI,0,0x20);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRate = in_ECX;
  in_RDI->cutoffFrequency = in_XMM0_Qa;
  return in_RDI;
}

Assistant:

MA_API ma_hpf1_config ma_hpf1_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency)
{
    ma_hpf1_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRate = sampleRate;
    config.cutoffFrequency = cutoffFrequency;

    return config;
}